

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void do_find_command_for_selection_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List all_cmds;
  Am_Value obj_mod_val;
  Am_Object this_cmd;
  Am_Object menu;
  Am_Value_List cmds_using_objects;
  Am_Object real_cmd;
  Am_Value_List objects;
  Am_Value_List obj_mod_list;
  
  Am_Object::Get_Object((Am_Object *)&obj_mod_val,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner((Am_Object *)&all_cmds,(Am_Slot_Flags)&obj_mod_val);
  Am_Object::Get_Object((Am_Object *)&cmds_using_objects,(Am_Slot_Key)&all_cmds,0x197);
  pAVar2 = Am_Object::Get((Am_Object *)&cmds_using_objects,0x169,0);
  Am_Value_List::Am_Value_List(&objects,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&cmds_using_objects);
  Am_Object::~Am_Object((Am_Object *)&all_cmds);
  Am_Object::~Am_Object((Am_Object *)&obj_mod_val);
  Am_Value_List::Am_Value_List(&cmds_using_objects);
  Am_Object::Get_Object((Am_Object *)&all_cmds,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Sibling(&menu,(Am_Slot_Key)&all_cmds,(ulong)Am_UNDO_SCROLL_GROUP);
  Am_Object::~Am_Object((Am_Object *)&all_cmds);
  pAVar2 = Am_Object::Get(&menu,0xa2,0);
  Am_Value_List::Am_Value_List(&all_cmds,pAVar2);
  this_cmd.data = (Am_Object_Data *)0x0;
  real_cmd.data = (Am_Object_Data *)0x0;
  obj_mod_val.type = 0;
  obj_mod_val.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&obj_mod_list);
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"selected ");
    poVar3 = operator<<(poVar3,&objects);
    poVar3 = std::operator<<(poVar3," all commands ");
    poVar3 = operator<<(poVar3,&all_cmds);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  Am_Value_List::Start(&all_cmds);
  do {
    bVar1 = Am_Value_List::Last(&all_cmds);
    if (bVar1) {
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&cmds_using_objects);
      Am_Object::Set(&menu,0x169,pAVar4,0);
      Am_Value_List::~Am_Value_List(&obj_mod_list);
      Am_Value::~Am_Value(&obj_mod_val);
      Am_Object::~Am_Object(&real_cmd);
      Am_Object::~Am_Object(&this_cmd);
      Am_Value_List::~Am_Value_List(&all_cmds);
      Am_Object::~Am_Object(&menu);
      Am_Value_List::~Am_Value_List(&cmds_using_objects);
      Am_Value_List::~Am_Value_List(&objects);
      return;
    }
    pAVar2 = Am_Value_List::Get(&all_cmds);
    Am_Object::operator=(&this_cmd,pAVar2);
    pAVar2 = Am_Object::Get(&this_cmd,0x153,0);
    Am_Object::operator=(&real_cmd,pAVar2);
    pAVar2 = Am_Object::Get(&real_cmd,0x16d,0);
    Am_Value::operator=(&obj_mod_val,pAVar2);
    if (am_sdebug == true) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  for cmd ");
      poVar3 = operator<<(poVar3,&this_cmd);
      poVar3 = std::operator<<(poVar3," real ");
      poVar3 = operator<<(poVar3,&real_cmd);
      poVar3 = std::operator<<(poVar3," obj mod ");
      poVar3 = operator<<(poVar3,&obj_mod_val);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ostream::flush();
    }
    bVar1 = Am_Value::Valid(&obj_mod_val);
    if (bVar1) {
      if (obj_mod_val.type == 0xa001) {
        Am_Value_List::Make_Empty(&obj_mod_list);
        Am_Value_List::Add(&obj_mod_list,&obj_mod_val,Am_TAIL,true);
      }
      else {
        bVar1 = Am_Value_List::Test(&obj_mod_val);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar3 = std::operator<<(poVar3,"Object Modified of ");
          poVar3 = operator<<(poVar3,&this_cmd);
          poVar3 = std::operator<<(poVar3," is not list or obj ");
          poVar3 = operator<<(poVar3,&obj_mod_val);
          std::endl<char,std::char_traits<char>>(poVar3);
          Am_Error();
        }
        Am_Value_List::operator=(&obj_mod_list,&obj_mod_val);
      }
      bVar1 = any_list_member(&objects,&obj_mod_list);
      if (bVar1) {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&this_cmd);
        Am_Value_List::Add(&cmds_using_objects,pAVar4,Am_TAIL,true);
      }
    }
    Am_Value_List::Next(&all_cmds);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_find_command_for_selection,
                 (Am_Object cmd))
{
  Am_Value_List objects = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                              .Get_Owner()
                              .Get_Object(Am_SELECTION_WIDGET)
                              .Get(Am_VALUE);
  Am_Value_List cmds_using_objects;
  Am_Object menu =
      cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Sibling(Am_UNDO_SCROLL_GROUP);
  Am_Value_List all_cmds = menu.Get(Am_ITEMS);
  Am_Object this_cmd, real_cmd;
  Am_Value obj_mod_val;
  Am_Value_List obj_mod_list;
  if (am_sdebug)
    std::cout << "selected " << objects << " all commands " << all_cmds
              << std::endl
              << std::flush;
  for (all_cmds.Start(); !all_cmds.Last(); all_cmds.Next()) {
    this_cmd = all_cmds.Get();
    real_cmd = this_cmd.Get(Am_ID);
    obj_mod_val = real_cmd.Get(Am_OBJECT_MODIFIED);
    if (am_sdebug)
      std::cout << "  for cmd " << this_cmd << " real " << real_cmd
                << " obj mod " << obj_mod_val << std::endl
                << std::flush;
    if (obj_mod_val.Valid()) {
      if (obj_mod_val.type == Am_OBJECT) {
        obj_mod_list.Make_Empty();
        obj_mod_list.Add(obj_mod_val);
      } else if (Am_Value_List::Test(obj_mod_val)) {
        obj_mod_list = obj_mod_val;
      } else
        Am_ERROR("Object Modified of " << this_cmd << " is not list or obj "
                                       << obj_mod_val);
      if (any_list_member(objects, obj_mod_list))
        cmds_using_objects.Add(this_cmd);
    }
  }
  menu.Set(Am_VALUE, cmds_using_objects);
}